

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matcher_tests.cpp
# Opt level: O0

void __thiscall iu_Matcher_x_iutest_x_Pair_Test::Body(iu_Matcher_x_iutest_x_Pair_Test *this)

{
  bool bVar1;
  detail *this_00;
  int *in_RCX;
  PairMatcher<iutest::detail::LeMatcher<int>,_int> *expected;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *v;
  AssertionResult *in_R8;
  string local_2a0;
  string local_280;
  AssertionHelper local_260;
  Fixed local_230;
  undefined1 local_98 [8];
  LeMatcher<int> local_90;
  PairMatcher<iutest::detail::LeMatcher<int>,_int> local_80;
  EachMatcher<iutest::detail::PairMatcher<iutest::detail::LeMatcher<int>,_int>_> local_60;
  undefined1 local_38 [8];
  AssertionResult iutest_ar;
  iu_Matcher_x_iutest_x_Pair_Test *this_local;
  
  iutest_ar._32_8_ = this;
  iutest::detail::AlwaysZero();
  local_98._4_4_ = 10;
  iutest::matchers::Le<int>((matchers *)(local_98 + 8),(int *)(local_98 + 4));
  local_98._0_4_ = 100;
  iutest::matchers::Pair<iutest::detail::LeMatcher<int>,int>
            (&local_80,(matchers *)(local_98 + 8),(LeMatcher<int> *)local_98,in_RCX);
  iutest::matchers::Each<iutest::detail::PairMatcher<iutest::detail::LeMatcher<int>,int>>
            (&local_60,(matchers *)&local_80,expected);
  iutest::detail::EachMatcher<iutest::detail::PairMatcher<iutest::detail::LeMatcher<int>,int>>::
  operator()((AssertionResult *)local_38,
             (EachMatcher<iutest::detail::PairMatcher<iutest::detail::LeMatcher<int>,int>> *)
             &local_60,
             (map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
             (anonymous_namespace)::gm);
  iutest::detail::EachMatcher<iutest::detail::PairMatcher<iutest::detail::LeMatcher<int>,_int>_>::
  ~EachMatcher(&local_60);
  iutest::detail::PairMatcher<iutest::detail::LeMatcher<int>,_int>::~PairMatcher(&local_80);
  iutest::detail::LeMatcher<int>::~LeMatcher((LeMatcher<int> *)(local_98 + 8));
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_38);
  if (!bVar1) {
    memset(&local_230,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_230);
    iutest::PrintToString<std::map<int,int,std::less<int>,std::allocator<std::pair<int_const,int>>>>
              (&local_2a0,(iutest *)(anonymous_namespace)::gm,v);
    this_00 = (detail *)std::__cxx11::string::c_str();
    iutest::detail::MatcherAssertionFailureMessage_abi_cxx11_
              (&local_280,this_00,"Each(Pair(Le(10), 100))",local_38,in_R8);
    iutest::AssertionHelper::AssertionHelper
              (&local_260,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp"
               ,0x161,&local_280,kNonFatalFailure);
    iutest::AssertionHelper::operator=(&local_260,&local_230);
    iutest::AssertionHelper::~AssertionHelper(&local_260);
    std::__cxx11::string::~string((string *)&local_280);
    std::__cxx11::string::~string((string *)&local_2a0);
    iutest::AssertionHelper::Fixed::~Fixed(&local_230);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_38);
  return;
}

Assistant:

IUTEST(Matcher, Pair)
{
    IUTEST_EXPECT_THAT(gm, Each(Pair(Le(10), 100)));
}